

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license++.cpp
# Opt level: O0

EVENT_TYPE acquire_license(char *product,LicenseLocation licenseLocation,LicenseInfo *license)

{
  bool bVar1;
  size_type sVar2;
  pointer this;
  reference pFVar3;
  AuditEvent *pAVar4;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> local_130;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> local_118;
  FullLicenseInfo *local_100;
  undefined1 local_f8 [8];
  EventRegistry validation_er;
  __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
  local_d8;
  iterator it;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenses_ok;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenses_with_errors;
  EVENT_TYPE result;
  allocator local_89;
  string local_88;
  undefined1 local_68 [8];
  EventRegistry er;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenses;
  LicenseReader lr;
  LicenseInfo *license_local;
  char *product_local;
  
  ::license::LicenseReader::LicenseReader
            ((LicenseReader *)
             &licenses.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&licenseLocation);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::vector
            ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             &er.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,product,&local_89);
  ::license::LicenseReader::readLicenses
            ((EventRegistry *)local_68,
             (LicenseReader *)
             &licenses.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_88,
             (vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             &er.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  sVar2 = std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::size
                    ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
                     &er.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (sVar2 == 0) {
    pAVar4 = ::license::EventRegistry::getLastFailure((EventRegistry *)local_68);
    licenses_with_errors.
    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = pAVar4->event_type;
  }
  else {
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::vector
              ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
               &licenses_ok.
                super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::vector
              ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)&it);
    local_d8._M_current =
         (FullLicenseInfo *)
         std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::begin
                   ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
                    &er.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      validation_er.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                    ::end((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                           *)&er.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = __gnu_cxx::operator!=
                        (&local_d8,
                         (__normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
                          *)&validation_er.logs.
                             super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      this = __gnu_cxx::
             __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
             ::operator->(&local_d8);
      ::license::FullLicenseInfo::validate((EventRegistry *)local_f8,this,0);
      bVar1 = ::license::EventRegistry::isGood((EventRegistry *)local_f8);
      if (bVar1) {
        pFVar3 = __gnu_cxx::
                 __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
                 ::operator*(&local_d8);
        std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::push_back
                  ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
                   &it,pFVar3);
      }
      else {
        pFVar3 = __gnu_cxx::
                 __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
                 ::operator*(&local_d8);
        std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::push_back
                  ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
                   &licenses_ok.
                    super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pFVar3);
      }
      ::license::EventRegistry::append((EventRegistry *)local_68,(EventRegistry *)local_f8);
      ::license::EventRegistry::~EventRegistry((EventRegistry *)local_f8);
      local_100 = (FullLicenseInfo *)
                  __gnu_cxx::
                  __normal_iterator<license::FullLicenseInfo_*,_std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>_>
                  ::operator++(&local_d8,0);
    }
    sVar2 = std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::size
                      ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                        *)&it);
    if (sVar2 == 0) {
      pAVar4 = ::license::EventRegistry::getLastFailure((EventRegistry *)local_68);
      licenses_with_errors.
      super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = pAVar4->event_type;
      std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::vector
                (&local_130,
                 (vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
                 &licenses_ok.
                  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      mergeLicenses(&local_130,license);
      std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
                (&local_130);
    }
    else {
      ::license::EventRegistry::turnErrosIntoWarnings((EventRegistry *)local_68);
      licenses_with_errors.
      super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = LICENSE_OK;
      std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::vector
                (&local_118,
                 (vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)&it)
      ;
      mergeLicenses(&local_118,license);
      std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
                (&local_118);
    }
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
              ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)&it);
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
              ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
               &licenses_ok.
                super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (license != (LicenseInfo *)0x0) {
    ::license::EventRegistry::exportLastEvents((EventRegistry *)local_68,license->status,5);
  }
  ::license::EventRegistry::~EventRegistry((EventRegistry *)local_68);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
             &er.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::license::LicenseReader::~LicenseReader
            ((LicenseReader *)
             &licenses.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (EVENT_TYPE)
         licenses_with_errors.
         super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
}

Assistant:

EVENT_TYPE acquire_license(const char * product,
		LicenseLocation licenseLocation, LicenseInfo* license) {
	license::LicenseReader lr = license::LicenseReader(licenseLocation);
	vector<license::FullLicenseInfo> licenses;
	license::EventRegistry er = lr.readLicenses(string(product), licenses);
	EVENT_TYPE result;
	if (licenses.size() > 0) {
		vector<license::FullLicenseInfo> licenses_with_errors;
		vector<license::FullLicenseInfo> licenses_ok;
		for (auto it = licenses.begin(); it != licenses.end(); it++) {
			license::EventRegistry validation_er = it->validate(0);
			if (validation_er.isGood()) {
				licenses_ok.push_back(*it);
			} else {
				licenses_with_errors.push_back(*it);
			}
			er.append(validation_er);
		}
		if (licenses_ok.size() > 0) {
			er.turnErrosIntoWarnings();
			result = LICENSE_OK;
			mergeLicenses(licenses_ok, license);
		} else {
			result = er.getLastFailure()->event_type;
			mergeLicenses(licenses_with_errors, license);
		}

	} else {
		result = er.getLastFailure()->event_type;
	}
	if (license != NULL) {
		er.exportLastEvents(license->status, 5);
	}
	return result;
}